

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdi::ControllerWidget::setControlVisible
          (ControllerWidget *this,WindowStateAction action,bool visible)

{
  undefined1 in_DL;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  SubControl subControl;
  SubControl in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffdb;
  SubControl flag;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar1;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = CONCAT13(in_DL,in_stack_ffffffffffffffe0) & 0x1ffffff;
  if (in_ESI == 4) {
    flag = SC_ComboBoxEditField;
  }
  else if (in_ESI == 6) {
    flag = SC_ComboBoxArrow;
  }
  else {
    flag = (SubControl)(in_ESI == 3);
  }
  if (flag != SC_None) {
    if ((char)(uVar1 >> 0x18) != '\0') {
      local_c.super_QFlagsStorage<QStyle::SubControl>.i =
           (QFlagsStorage<QStyle::SubControl>)
           QFlags<QStyle::SubControl>::operator&
                     ((QFlags<QStyle::SubControl> *)(in_RDI + 0x30),in_stack_ffffffffffffffbc);
      QFlags<QStyle::SubControl>::operator!((QFlags<QStyle::SubControl> *)&local_c);
    }
    QFlags<QStyle::SubControl>::setFlag
              ((QFlags<QStyle::SubControl> *)CONCAT44(in_ESI,uVar1),flag,
               (bool)in_stack_ffffffffffffffdb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::setControlVisible(QMdiSubWindowPrivate::WindowStateAction action, bool visible)
{
    QStyle::SubControl subControl = QStyle::SC_None;

    // Map action from QMdiSubWindowPrivate::WindowStateAction to QStyle::SubControl.
    if (action == QMdiSubWindowPrivate::MaximizeAction)
        subControl = QStyle::SC_MdiNormalButton;
    else if (action == QMdiSubWindowPrivate::CloseAction)
        subControl = QStyle::SC_MdiCloseButton;
    else if (action == QMdiSubWindowPrivate::MinimizeAction)
        subControl = QStyle::SC_MdiMinButton;

    if (subControl == QStyle::SC_None)
        return;

    visibleControls.setFlag(subControl, visible && !(visibleControls & subControl));
}